

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,ScopedStmtBlock *stmt)

{
  ulong uVar1;
  char cVar2;
  uint32_t uVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  string local_80;
  string_view local_60;
  ulong local_50;
  uint64_t i;
  string local_38;
  StmtBlock *local_18;
  ScopedStmtBlock *stmt_local;
  SystemVerilogCodeGen *this_local;
  
  local_18 = &stmt->super_StmtBlock;
  stmt_local = (ScopedStmtBlock *)this;
  if ((this->generator_->debug & 1U) != 0) {
    uVar3 = Stream::line_no(&this->stream_);
    (((StmtBlock *)&local_18->super_Stmt)->super_Stmt).super_IRNode.verilog_ln = uVar3;
  }
  poVar5 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,"begin");
  block_label_abi_cxx11_(&local_38,this,local_18);
  poVar5 = std::operator<<(poVar5,(string *)&local_38);
  cVar2 = Stream::endl(&this->stream_);
  std::operator<<(poVar5,cVar2);
  std::__cxx11::string::~string((string *)&local_38);
  this->indent_ = this->indent_ + 1;
  local_50 = 0;
  while( true ) {
    uVar1 = local_50;
    iVar4 = (*(local_18->super_Stmt).super_IRNode._vptr_IRNode[1])();
    if (CONCAT44(extraout_var,iVar4) <= uVar1) break;
    iVar4 = (*(local_18->super_Stmt).super_IRNode._vptr_IRNode[2])(local_18,local_50);
    (**this->_vptr_SystemVerilogCodeGen)(this,CONCAT44(extraout_var_00,iVar4));
    local_50 = local_50 + 1;
  }
  this->indent_ = this->indent_ - 1;
  local_60 = indent(this);
  pbVar6 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                           &(this->stream_).super_stringstream.field_0x10,local_60);
  poVar5 = std::operator<<(pbVar6,"end");
  block_label_abi_cxx11_(&local_80,this,local_18);
  poVar5 = std::operator<<(poVar5,(string *)&local_80);
  cVar2 = Stream::endl(&this->stream_);
  std::operator<<(poVar5,cVar2);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(kratos::ScopedStmtBlock* stmt) {
    if (generator_->debug) {
        stmt->verilog_ln = stream_.line_no();
    }

    stream_ << "begin" << block_label(stmt) << stream_.endl();
    indent_++;

    for (uint64_t i = 0; i < stmt->child_count(); i++) {
        dispatch_node(stmt->get_child(i));
    }

    indent_--;
    stream_ << indent() << "end" << block_label(stmt) << stream_.endl();
}